

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O3

r_memory_map * __thiscall
pager::map_page_from(r_memory_map *__return_storage_ptr__,pager *this,uint64_t ofs)

{
  int fd;
  r_memory_map local_38;
  
  fd = fileno((FILE *)(this->_f)._f);
  r_memory_map::r_memory_map
            (&local_38,fd,ofs & 0xfffffffffffff000,0x1000,3,5,(ulong)((uint)ofs & 0xfff));
  r_memory_map::r_memory_map(__return_storage_ptr__,&local_38);
  r_memory_map::~r_memory_map(&local_38);
  return __return_storage_ptr__;
}

Assistant:

r_memory_map pager::map_page_from(uint64_t ofs) const
{
    auto blockStart = block_start_from(ofs);
    size_t blockOfs = ofs - blockStart;

    return std::move(r_memory_map(fileno(_f),
                                blockStart,
                                pager::block_size(),
                                r_memory_map::MM_PROT_READ | r_memory_map::MM_PROT_WRITE,
                                r_memory_map::MM_TYPE_FILE | r_memory_map::MM_SHARED,
                                blockOfs));
}